

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O1

int __thiscall sptk::swipe::bilookiv(swipe *this,intvector yr_vector,int key,int lo)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int hi;
  int iVar4;
  uint uVar5;
  
  iVar2 = (int)this;
  uVar3 = (ulong)this & 0xffffffff;
  iVar4 = iVar2 - (key - 1U);
  uVar1 = key - 1U;
  while (1 < iVar4) {
    uVar5 = (int)((int)uVar3 + uVar1) >> 1;
    if ((int)yr_vector.v < *(int *)(yr_vector._0_8_ + (long)(int)uVar5 * 4)) {
      uVar3 = (ulong)uVar5;
      uVar5 = uVar1;
    }
    iVar2 = (int)uVar3;
    uVar1 = uVar5;
    iVar4 = iVar2 - uVar5;
  }
  return iVar2;
}

Assistant:

int bilookiv(intvector yr_vector, int key, int lo) {
    int md;
    int hi = yr_vector.x;
    lo--;
    while (hi - lo > 1) {
        md = (hi + lo) >> 1;
        if (yr_vector.v[md] > key)
            hi = md;
        else
            lo = md;
    }
    return(hi);
}